

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zsnode_bmod.c
# Opt level: O3

int zsnode_bmod(int jcol,int jsupno,int fsupc,doublecomplex *dense,doublecomplex *tempv,
               GlobalLU_t *Glu,SuperLUStat_t *stat)

{
  undefined8 *puVar1;
  double *pdVar2;
  int iVar3;
  flops_t *pfVar4;
  int_t *piVar5;
  void *pvVar6;
  int_t *piVar7;
  int_t *piVar8;
  undefined1 auVar9 [16];
  double dVar10;
  uint nrow;
  int iVar11;
  ulong uVar12;
  int iVar13;
  int ldm;
  doublecomplex *rhs;
  long lVar14;
  double *pdVar15;
  
  pfVar4 = stat->ops;
  piVar5 = Glu->xlsub;
  pvVar6 = Glu->lusup;
  piVar7 = Glu->xlusup;
  iVar13 = piVar7[jcol];
  lVar14 = (long)piVar5[fsupc];
  if (piVar5[fsupc] < piVar5[(long)fsupc + 1]) {
    piVar8 = Glu->lsub;
    pdVar15 = (double *)((long)iVar13 * 0x10 + (long)pvVar6);
    do {
      iVar3 = piVar8[lVar14];
      dVar10 = dense[iVar3].i;
      *pdVar15 = dense[iVar3].r;
      pdVar15[1] = dVar10;
      dense[iVar3].r = 0.0;
      dense[iVar3].i = 0.0;
      lVar14 = lVar14 + 1;
      pdVar15 = pdVar15 + 2;
      iVar13 = iVar13 + 1;
    } while (lVar14 < piVar5[(long)fsupc + 1]);
  }
  piVar7[(long)jcol + 1] = iVar13;
  iVar13 = jcol - fsupc;
  if (iVar13 != 0 && fsupc <= jcol) {
    iVar3 = piVar7[fsupc];
    ldm = piVar5[(long)fsupc + 1] - piVar5[fsupc];
    nrow = ldm - iVar13;
    iVar11 = piVar7[jcol];
    pfVar4[0x13] = (float)((iVar13 + -1) * iVar13 * 4) + pfVar4[0x13];
    pfVar4[0x14] = (float)(int)(iVar13 * nrow * 8) + pfVar4[0x14];
    rhs = (doublecomplex *)((long)iVar11 * 0x10 + (long)pvVar6);
    zlsolve(ldm,iVar13,(doublecomplex *)((long)iVar3 * 0x10 + (long)pvVar6),rhs);
    zmatvec(ldm,nrow,iVar13,(doublecomplex *)(((long)iVar3 + (long)iVar13) * 0x10 + (long)pvVar6),
            rhs,tempv);
    if (0 < (int)nrow) {
      iVar11 = iVar11 + iVar13;
      lVar14 = 0;
      uVar12 = 0;
      do {
        pdVar2 = (double *)((long)pvVar6 + lVar14 + (long)iVar11 * 0x10);
        pdVar15 = (double *)((long)&tempv->r + lVar14);
        dVar10 = pdVar2[1] - pdVar15[1];
        auVar9._8_4_ = SUB84(dVar10,0);
        auVar9._0_8_ = *pdVar2 - *pdVar15;
        auVar9._12_4_ = (int)((ulong)dVar10 >> 0x20);
        *(undefined1 (*) [16])((long)pvVar6 + lVar14 + (long)iVar11 * 0x10) = auVar9;
        puVar1 = (undefined8 *)((long)&tempv->r + lVar14);
        *puVar1 = 0;
        puVar1[1] = 0;
        uVar12 = uVar12 + 1;
        lVar14 = lVar14 + 0x10;
      } while (uVar12 < nrow);
    }
  }
  return 0;
}

Assistant:

int
zsnode_bmod (
	    const int  jcol,	  /* in */
	    const int  jsupno,    /* in */
	    const int  fsupc,     /* in */
	    doublecomplex     *dense,    /* in */
	    doublecomplex     *tempv,    /* working array */
	    GlobalLU_t *Glu,      /* modified */
	    SuperLUStat_t *stat   /* output */
	    )
{
#ifdef USE_VENDOR_BLAS
#ifdef _CRAY
    _fcd ftcs1 = _cptofcd("L", strlen("L")),
	 ftcs2 = _cptofcd("N", strlen("N")),
	 ftcs3 = _cptofcd("U", strlen("U"));
#endif
    int            incx = 1, incy = 1;
    doublecomplex         alpha = {-1.0, 0.0},  beta = {1.0, 0.0};
#endif

    doublecomplex   comp_zero = {0.0, 0.0};
    int     nsupc, nsupr, nrow;
    int_t   isub, irow;
    int_t   ufirst, nextlu;
    int_t   *lsub, *xlsub;
    doublecomplex *lusup;
    int_t   *xlusup, luptr;
    flops_t *ops = stat->ops;

    lsub    = Glu->lsub;
    xlsub   = Glu->xlsub;
    lusup   = (doublecomplex *) Glu->lusup;
    xlusup  = Glu->xlusup;

    nextlu = xlusup[jcol];
    
    /*
     *	Process the supernodal portion of L\U[*,j]
     */
    for (isub = xlsub[fsupc]; isub < xlsub[fsupc+1]; isub++) {
  	irow = lsub[isub];
	lusup[nextlu] = dense[irow];
        dense[irow] = comp_zero;
	++nextlu;
    }

    xlusup[jcol + 1] = nextlu;	/* Initialize xlusup for next column */
    
    if ( fsupc < jcol ) {

	luptr = xlusup[fsupc];
	nsupr = xlsub[fsupc+1] - xlsub[fsupc];
	nsupc = jcol - fsupc;	/* Excluding jcol */
	ufirst = xlusup[jcol];	/* Points to the beginning of column
				   jcol in supernode L\U(jsupno). */
	nrow = nsupr - nsupc;

	ops[TRSV] += 4 * nsupc * (nsupc - 1);
	ops[GEMV] += 8 * nrow * nsupc;

#ifdef USE_VENDOR_BLAS
#ifdef _CRAY
	CTRSV( ftcs1, ftcs2, ftcs3, &nsupc, &lusup[luptr], &nsupr, 
	      &lusup[ufirst], &incx );
	CGEMV( ftcs2, &nrow, &nsupc, &alpha, &lusup[luptr+nsupc], &nsupr, 
		&lusup[ufirst], &incx, &beta, &lusup[ufirst+nsupc], &incy );
#else
	ztrsv_( "L", "N", "U", &nsupc, &lusup[luptr], &nsupr, 
	      &lusup[ufirst], &incx );
	zgemv_( "N", &nrow, &nsupc, &alpha, &lusup[luptr+nsupc], &nsupr, 
		&lusup[ufirst], &incx, &beta, &lusup[ufirst+nsupc], &incy );
#endif
#else
	zlsolve ( nsupr, nsupc, &lusup[luptr], &lusup[ufirst] );
	zmatvec ( nsupr, nrow, nsupc, &lusup[luptr+nsupc], 
			&lusup[ufirst], &tempv[0] );

	int_t i, iptr; 
        /* Scatter tempv[*] into lusup[*] */
	iptr = ufirst + nsupc;
	for (i = 0; i < nrow; i++) {
	    z_sub(&lusup[iptr], &lusup[iptr], &tempv[i]);
            ++iptr;
	    tempv[i] = comp_zero;
	}
#endif

    }

    return 0;
}